

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O1

string * UniqueObjectHelper<std::__cxx11::string>(string *__return_storage_ptr__,int index)

{
  size_t sVar1;
  char buffer [64];
  char acStack_58 [72];
  
  snprintf(acStack_58,0x40,"%d",index);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_58,acStack_58 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

string UniqueObjectHelper(int index) {
  char buffer[64];
  snprintf(buffer, sizeof(buffer), "%d", index);
  return buffer;
}